

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O3

byte4 __thiscall
ServerService::readAck(ServerService *this,int socketFD,sockaddr_storage clientDetails)

{
  byte *buffer;
  ssize_t sVar1;
  ServerSegment *pSVar2;
  byte4 bVar3;
  ServerService *this_00;
  socklen_t local_1c;
  
  buffer = (byte *)calloc(0x5c0,1);
  local_1c = 0x80;
  bVar3 = 0;
  this_00 = (ServerService *)(ulong)(uint)socketFD;
  sVar1 = recvfrom(socketFD,buffer,0x5c0,0,(sockaddr *)&clientDetails,&local_1c);
  if (sVar1 == 0) {
    free(buffer);
  }
  else {
    pSVar2 = parseRequest(this_00,buffer);
    if (pSVar2->ackFlag == 'Y') {
      free(buffer);
      bVar3 = pSVar2->ackNumber;
    }
    else {
      operator_delete(pSVar2,0x18);
      bVar3 = 0;
    }
  }
  return bVar3;
}

Assistant:

byte4 ServerService::readAck(int socketFD, struct sockaddr_storage clientDetails) {
    byte *buffer = (byte *) calloc(MTU, sizeof(byte));
    socklen_t clientLength = sizeof(clientDetails);
    memset(buffer, 0, MTU);

    if (recvfrom(socketFD, buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength)) {
        ServerSegment *temp = parseRequest(buffer);
        if (temp->ackFlag == TRUE) {
            free(buffer);
            return temp->ackNumber;
        }
        delete temp;
    } else {
        //若 ack 标志位为 FALSE 则直接丢弃
        free(buffer);
    }
    return 0;
}